

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_union(lyd_node_leaf_list *leaf,lys_type *type,int store,int ignore_fail,
                 lys_type **resolved_type)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  lys_type *plVar4;
  void **local_a8;
  void **local_90;
  void **local_80;
  void **local_68;
  char *json_val;
  int req_inst;
  int ext_dep;
  int success;
  int found;
  int_log_opts prev_ilo;
  lyd_node *ret;
  lys_type *t;
  ly_ctx *ctx;
  lys_type **resolved_type_local;
  int ignore_fail_local;
  int store_local;
  lys_type *type_local;
  lyd_node_leaf_list *leaf_local;
  
  t = (lys_type *)leaf->schema->module->ctx;
  bVar1 = false;
  local_68 = (void **)0x0;
  ctx = (ly_ctx *)resolved_type;
  resolved_type_local._0_4_ = ignore_fail;
  resolved_type_local._4_4_ = store;
  _ignore_fail_local = type;
  type_local = (lys_type *)leaf;
  if (type->base != LY_TYPE_UNION) {
    __assert_fail("type->base == LY_TYPE_UNION",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x1f49,
                  "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                 );
  }
  if ((leaf->value_type == LY_TYPE_UNION) ||
     ((leaf->value_type == LY_TYPE_INST && ((leaf->value_flags & 1) != 0)))) {
    local_68 = (void **)lydict_insert((ly_ctx *)t,(leaf->value).binary,0);
  }
  if (resolved_type_local._4_4_ != 0) {
    lyd_free_value(*(lyd_val *)(type_local + 1),*(LY_DATA_TYPE *)&type_local[1].ext,
                   *(uint8_t *)((long)&type_local[1].ext + 4),
                   (lys_type *)(*(long *)type_local + 0x80),
                   (char *)(type_local->info).str.patterns_pcre,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,
                   (uint8_t *)0x0);
    memset(type_local + 1,0,8);
  }
  ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,(int_log_opts *)&success,(ly_err_item **)0x0);
  ret = (lyd_node *)0x0;
  ext_dep = 0;
  while (ret = (lyd_node *)lyp_get_next_union_type(_ignore_fail_local,(lys_type *)ret,&ext_dep),
        ret != (lyd_node *)0x0) {
    ext_dep = 0;
    if (*(LY_DATA_TYPE *)&ret->schema == LY_TYPE_INST) {
      if (local_68 == (void **)0x0) {
        local_80 = (type_local->info).str.patterns_pcre;
      }
      else {
        local_80 = local_68;
      }
      iVar2 = check_instid_ext_dep(*(lys_node **)type_local,(char *)local_80);
      if (((int)resolved_type_local == 1) || ((iVar2 != 0 && ((int)resolved_type_local == 2)))) {
        json_val._4_4_ = -1;
      }
      else {
        json_val._4_4_ = (int)*(char *)&ret->prev;
      }
      if (local_68 == (void **)0x0) {
        local_90 = (type_local->info).str.patterns_pcre;
      }
      else {
        local_90 = local_68;
      }
      iVar3 = resolve_instid((lyd_node *)type_local,(char *)local_90,json_val._4_4_,
                             (lyd_node **)&found);
      if (iVar3 == 0) {
        if (resolved_type_local._4_4_ != 0) {
          if ((_found == (lyd_node *)0x0) || (iVar2 != 0)) {
            if (local_68 == (void **)0x0) {
              type_local[1].base = LY_TYPE_DER;
              type_local[1].value_flags = '\0';
              type_local[1].ext_size = '\0';
              *(undefined2 *)&type_local[1].field_0x6 = 0;
            }
            else {
              *(void ***)(type_local + 1) = local_68;
              local_68 = (void **)0x0;
            }
            *(undefined4 *)&type_local[1].ext = 8;
            *(byte *)((long)&type_local[1].ext + 4) = *(byte *)((long)&type_local[1].ext + 4) | 1;
          }
          else {
            *(lyd_node **)(type_local + 1) = _found;
            *(undefined4 *)&type_local[1].ext = 8;
            if (local_68 != (void **)0x0) {
              lydict_remove((ly_ctx *)**(undefined8 **)(*(long *)type_local + 0x30),
                            (char *)(type_local->info).str.patterns_pcre);
              (type_local->info).str.patterns_pcre = local_68;
              local_68 = (void **)0x0;
            }
          }
        }
        bVar1 = true;
      }
    }
    else if (*(LY_DATA_TYPE *)&ret->schema == LY_TYPE_LEAFREF) {
      if (((int)resolved_type_local == 1) ||
         (((*(ushort *)(*(long *)type_local + 0x18) & 0x800) != 0 && ((int)resolved_type_local == 2)
          ))) {
        json_val._4_4_ = -1;
      }
      else {
        json_val._4_4_ = (int)(char)ret->hash;
      }
      iVar2 = resolve_leafref((lyd_node_leaf_list *)type_local,
                              (((lys_type_info *)&ret->prev)->lref).path,json_val._4_4_,
                              (lyd_node **)&found);
      if (iVar2 == 0) {
        if (resolved_type_local._4_4_ != 0) {
          if ((_found == (lyd_node *)0x0) ||
             ((*(ushort *)(*(long *)type_local + 0x18) & 0x800) != 0)) {
            ly_ilo_restore((ly_ctx *)0x0,success,(ly_err_item *)0x0,0);
            plVar4 = lyp_parse_value((lys_type *)ret,(char **)&(type_local->info).str.patterns_pcre,
                                     (lyxml_elem *)0x0,(lyd_node_leaf_list *)type_local,
                                     (lyd_attr *)0x0,(lys_module *)0x0,1,0,0);
            if (plVar4 == (lys_type *)0x0) {
              return -1;
            }
            ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,(int_log_opts *)&success,(ly_err_item **)0x0);
          }
          else {
            *(lyd_node **)(type_local + 1) = _found;
            *(undefined4 *)&type_local[1].ext = 9;
          }
        }
        bVar1 = true;
      }
    }
    else {
      plVar4 = lyp_parse_value((lys_type *)ret,(char **)&(type_local->info).str.patterns_pcre,
                               (lyxml_elem *)0x0,(lyd_node_leaf_list *)type_local,(lyd_attr *)0x0,
                               (lys_module *)0x0,resolved_type_local._4_4_,0,0);
      if (plVar4 != (lys_type *)0x0) {
        bVar1 = true;
      }
    }
    if (bVar1) break;
    if (resolved_type_local._4_4_ != 0) {
      lyd_free_value(*(lyd_val *)(type_local + 1),*(LY_DATA_TYPE *)&type_local[1].ext,
                     *(uint8_t *)((long)&type_local[1].ext + 4),(lys_type *)ret,
                     (char *)(type_local->info).str.patterns_pcre,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0
                     ,(uint8_t *)0x0);
      memset(type_local + 1,0,8);
    }
  }
  ly_ilo_restore((ly_ctx *)0x0,success,(ly_err_item *)0x0,0);
  if (local_68 != (void **)0x0) {
    if (bVar1) {
      lydict_remove((ly_ctx *)**(undefined8 **)(*(long *)type_local + 0x30),(char *)local_68);
    }
    else {
      if (*(int *)&type_local[1].ext != 0xb) {
        __assert_fail("leaf->value_type == LY_TYPE_UNION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x1fb6,
                      "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                     );
      }
      *(void ***)(type_local + 1) = local_68;
    }
  }
  if (bVar1) {
    if (ctx != (ly_ctx *)0x0) {
      (ctx->dict).hash_tab = (hash_table *)ret;
    }
  }
  else if (((int)resolved_type_local == 0) || ((_ignore_fail_local->info).uni.has_ptr_type == 0)) {
    if ((type_local->info).str.patterns_pcre == (void **)0x0) {
      local_a8 = (void **)0x1eea57;
    }
    else {
      local_a8 = (type_local->info).str.patterns_pcre;
    }
    ly_vlog((ly_ctx *)t,LYE_INVAL,LY_VLOG_LYD,type_local,local_a8,**(undefined8 **)type_local);
    return 1;
  }
  return 0;
}

Assistant:

int
resolve_union(struct lyd_node_leaf_list *leaf, struct lys_type *type, int store, int ignore_fail,
              struct lys_type **resolved_type)
{
    struct ly_ctx *ctx = leaf->schema->module->ctx;
    struct lys_type *t;
    struct lyd_node *ret;
    enum int_log_opts prev_ilo;
    int found, success = 0, ext_dep, req_inst;
    const char *json_val = NULL;

    assert(type->base == LY_TYPE_UNION);

    if ((leaf->value_type == LY_TYPE_UNION) || ((leaf->value_type == LY_TYPE_INST) && (leaf->value_flags & LY_VALUE_UNRES))) {
        /* either NULL or instid previously converted to JSON */
        json_val = lydict_insert(ctx, leaf->value.string, 0);
    }

    if (store) {
        lyd_free_value(leaf->value, leaf->value_type, leaf->value_flags, &((struct lys_node_leaf *)leaf->schema)->type,
                       leaf->value_str, NULL, NULL, NULL);
        memset(&leaf->value, 0, sizeof leaf->value);
    }

    /* turn logging off, we are going to try to validate the value with all the types in order */
    ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, 0);

    t = NULL;
    found = 0;
    while ((t = lyp_get_next_union_type(type, t, &found))) {
        found = 0;

        switch (t->base) {
        case LY_TYPE_LEAFREF:
            if ((ignore_fail == 1) || ((leaf->schema->flags & LYS_LEAFREF_DEP) && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.lref.req;
            }

            if (!resolve_leafref(leaf, t->info.lref.path, req_inst, &ret)) {
                if (store) {
                    if (ret && !(leaf->schema->flags & LYS_LEAFREF_DEP)) {
                        /* valid resolved */
                        leaf->value.leafref = ret;
                        leaf->value_type = LY_TYPE_LEAFREF;
                    } else {
                        /* valid unresolved */
                        ly_ilo_restore(NULL, prev_ilo, NULL, 0);
                        if (!lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, NULL, 1, 0, 0)) {
                            return -1;
                        }
                        ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
                    }
                }

                success = 1;
            }
            break;
        case LY_TYPE_INST:
            ext_dep = check_instid_ext_dep(leaf->schema, (json_val ? json_val : leaf->value_str));
            if ((ignore_fail == 1) || (ext_dep && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.inst.req;
            }

            if (!resolve_instid((struct lyd_node *)leaf, (json_val ? json_val : leaf->value_str), req_inst, &ret)) {
                if (store) {
                    if (ret && !ext_dep) {
                        /* valid resolved */
                        leaf->value.instance = ret;
                        leaf->value_type = LY_TYPE_INST;

                        if (json_val) {
                            lydict_remove(leaf->schema->module->ctx, leaf->value_str);
                            leaf->value_str = json_val;
                            json_val = NULL;
                        }
                    } else {
                        /* valid unresolved */
                        if (json_val) {
                            /* put the JSON val back */
                            leaf->value.string = json_val;
                            json_val = NULL;
                        } else {
                            leaf->value.instance = NULL;
                        }
                        leaf->value_type = LY_TYPE_INST;
                        leaf->value_flags |= LY_VALUE_UNRES;
                    }
                }

                success = 1;
            }
            break;
        default:
            if (lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, NULL, store, 0, 0)) {
                success = 1;
            }
            break;
        }

        if (success) {
            break;
        }

        /* erase possible present and invalid value data */
        if (store) {
            lyd_free_value(leaf->value, leaf->value_type, leaf->value_flags, t, leaf->value_str, NULL, NULL, NULL);
            memset(&leaf->value, 0, sizeof leaf->value);
        }
    }

    /* turn logging back on */
    ly_ilo_restore(NULL, prev_ilo, NULL, 0);

    if (json_val) {
        if (!success) {
            /* put the value back for now */
            assert(leaf->value_type == LY_TYPE_UNION);
            leaf->value.string = json_val;
        } else {
            /* value was ultimately useless, but we could not have known */
            lydict_remove(leaf->schema->module->ctx, json_val);
        }
    }

    if (success) {
        if (resolved_type) {
            *resolved_type = t;
        }
    } else if (!ignore_fail || !type->info.uni.has_ptr_type) {
        /* not found and it is required */
        LOGVAL(ctx, LYE_INVAL, LY_VLOG_LYD, leaf, leaf->value_str ? leaf->value_str : "", leaf->schema->name);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;

}